

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

void ImGui::SetKeyOwnersForKeyChord(ImGuiKeyChord key_chord,ImGuiID owner_id,ImGuiInputFlags flags)

{
  if (((uint)key_chord >> 0xc & 1) != 0) {
    SetKeyOwner(ImGuiKey_ModCtrl,owner_id,flags);
  }
  if (((uint)key_chord >> 0xd & 1) != 0) {
    SetKeyOwner(ImGuiKey_ModShift,owner_id,flags);
  }
  if (((uint)key_chord >> 0xe & 1) != 0) {
    SetKeyOwner(ImGuiKey_ModAlt,owner_id,flags);
  }
  if ((short)key_chord < 0) {
    SetKeyOwner(ImGuiKey_ModSuper,owner_id,flags);
  }
  if ((key_chord & ~ImGuiMod_Mask_) != ImGuiKey_KeysData_OFFSET) {
    SetKeyOwner(key_chord & ~ImGuiMod_Mask_,owner_id,flags);
    return;
  }
  return;
}

Assistant:

void ImGui::SetKeyOwnersForKeyChord(ImGuiKeyChord key_chord, ImGuiID owner_id, ImGuiInputFlags flags)
{
    if (key_chord & ImGuiMod_Ctrl)      { SetKeyOwner(ImGuiMod_Ctrl, owner_id, flags); }
    if (key_chord & ImGuiMod_Shift)     { SetKeyOwner(ImGuiMod_Shift, owner_id, flags); }
    if (key_chord & ImGuiMod_Alt)       { SetKeyOwner(ImGuiMod_Alt, owner_id, flags); }
    if (key_chord & ImGuiMod_Super)     { SetKeyOwner(ImGuiMod_Super, owner_id, flags); }
    if (key_chord & ~ImGuiMod_Mask_)    { SetKeyOwner((ImGuiKey)(key_chord & ~ImGuiMod_Mask_), owner_id, flags); }
}